

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&,kj::None_const&>&,char_const(&)[65]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
          *params,char (*params_1) [65])

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [65];
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_88;
  size_t local_80;
  ArrayDisposer *pAStack_78;
  String local_70;
  String local_58;
  StringPtr local_38;
  char *local_28;
  undefined8 local_20;
  
  this->exception = (Exception *)0x0;
  local_28 = "(can\'t stringify)";
  local_20 = 0x12;
  local_38.content.ptr = "(can\'t stringify)";
  local_38.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_58,(_ *)&local_28,(StringPtr *)(file + 0x10),&local_38,(StringPtr *)0x12);
  local_88 = local_58.content.ptr;
  local_80 = local_58.content.size_;
  pAStack_78 = local_58.content.disposer;
  str<char_const(&)[65]>
            (&local_70,(kj *)"bug in KJ HTTP: only one HTTP stream wrapper can exist at a time",
             params_00);
  ppcVar4 = &local_88;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      );
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_80 + lVar3);
      *(undefined8 *)((long)&local_88 + lVar3) = 0;
      *(undefined8 *)((long)&local_80 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_78 + lVar3))
                (*(undefined8 **)((long)&pAStack_78 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}